

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::TableBinding::Bind
          (BindResult *__return_storage_ptr__,TableBinding *this,ColumnRefExpression *colref,
          idx_t depth)

{
  column_t column_id;
  bool bVar1;
  int iVar2;
  string *__k;
  iterator iVar3;
  undefined4 extraout_var;
  iterator iVar4;
  reference pvVar5;
  column_t column_index;
  LogicalType col_type;
  optional_ptr<duckdb::StandardEntry,_true> entry;
  ColumnBinding binding;
  Expression *local_110;
  LogicalIndex local_108;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_100;
  LogicalType local_f8;
  optional_ptr<duckdb::StandardEntry,_true> local_e0;
  idx_t local_d8;
  ColumnBinding local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [128];
  
  local_d8 = depth;
  __k = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(this->super_Binding).name_map,__k);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    (*(this->super_Binding)._vptr_Binding[2])((ErrorData *)local_a0,this,__k);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_a0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_a0 + 0x48));
    if ((undefined1 *)local_a0._40_8_ != local_a0 + 0x38) {
      operator_delete((void *)local_a0._40_8_);
    }
    if ((undefined1 *)local_a0._8_8_ != local_a0 + 0x18) {
      operator_delete((void *)local_a0._8_8_);
    }
  }
  else {
    column_id = *(column_t *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                        ._M_cur + 0x28);
    local_108.index = column_id;
    iVar2 = (*(this->super_Binding)._vptr_Binding[4])(this);
    local_e0.ptr = (StandardEntry *)CONCAT44(extraout_var,iVar2);
    if ((TableCatalogEntry *)local_e0.ptr != (TableCatalogEntry *)0x0) {
      bVar1 = IsVirtualColumn(column_id);
      if (!bVar1) {
        optional_ptr<duckdb::StandardEntry,_true>::CheckValid(&local_e0);
        TableCatalogEntry::GetColumn((TableCatalogEntry *)local_e0.ptr,local_108);
      }
    }
    LogicalType::LogicalType(&local_f8);
    iVar4 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->virtual_columns)._M_h,&local_108.index);
    if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
        _M_cur == (__node_type *)0x0) {
      pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                         (&(this->super_Binding).types,local_108.index);
      if (&local_f8 != pvVar5) {
        local_f8.id_ = pvVar5->id_;
        local_f8.physical_type_ = pvVar5->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&local_f8.type_info_,&pvVar5->type_info_)
        ;
      }
      if ((colref->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[](&(this->super_Binding).names,local_108.index);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(colref->super_ParsedExpression).super_BaseExpression.alias);
      }
    }
    else if (&local_f8 !=
             (LogicalType *)
             ((long)iVar4.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                    ._M_cur + 0x30)) {
      local_f8.id_ = *(LogicalTypeId *)
                      ((long)iVar4.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                             ._M_cur + 0x30);
      local_f8.physical_type_ =
           *(PhysicalType *)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                   ._M_cur + 0x31);
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&local_f8.type_info_,
                 (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                        ._M_cur + 0x38));
    }
    local_d0 = GetColumnBinding(this,local_108.index);
    (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_c0,colref);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&>
              ((duckdb *)&local_110,&local_c0,&local_f8,&local_d0,&local_d8);
    local_100._M_head_impl = local_110;
    local_110 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_100);
    if (local_100._M_head_impl != (Expression *)0x0) {
      (*((local_100._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_100._M_head_impl = (Expression *)0x0;
    if (local_110 != (Expression *)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
    local_110 = (Expression *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    LogicalType::~LogicalType(&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult TableBinding::Bind(ColumnRefExpression &colref, idx_t depth) {
	auto &column_name = colref.GetColumnName();
	column_t column_index;
	bool success = false;
	success = TryGetBindingIndex(column_name, column_index);
	if (!success) {
		return BindResult(ColumnNotFoundError(column_name));
	}
	auto entry = GetStandardEntry();
	if (entry && !IsVirtualColumn(column_index)) {
		D_ASSERT(entry->type == CatalogType::TABLE_ENTRY);
		// Either there is no table, or the columns category has to be standard
		auto &table_entry = entry->Cast<TableCatalogEntry>();
		auto &column_entry = table_entry.GetColumn(LogicalIndex(column_index));
		(void)table_entry;
		(void)column_entry;
		D_ASSERT(column_entry.Category() == TableColumnType::STANDARD);
	}
	// fetch the type of the column
	LogicalType col_type;
	auto ventry = virtual_columns.find(column_index);
	if (ventry != virtual_columns.end()) {
		// virtual column - fetch type from there
		col_type = ventry->second.type;
	} else {
		// normal column: fetch type from base column
		col_type = types[column_index];
		if (colref.GetAlias().empty()) {
			colref.SetAlias(names[column_index]);
		}
	}
	ColumnBinding binding = GetColumnBinding(column_index);
	return BindResult(make_uniq<BoundColumnRefExpression>(colref.GetName(), col_type, binding, depth));
}